

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

bool __thiscall Memory::Recycler::StartConcurrent(Recycler *this,CollectionState state)

{
  CollectionState newValue;
  undefined4 *puVar1;
  ThreadService *pTVar2;
  code *pcVar3;
  bool bVar4;
  char cVar5;
  DWORD DVar6;
  HANDLE hEvent;
  undefined8 *in_FS_OFFSET;
  
  DVar6 = GetTickCount();
  this->tickCountStartConcurrent = DVar6;
  newValue = (this->collectionState).value;
  ObservableValue<Memory::CollectionState>::SetValue(&this->collectionState,state);
  if (*(long *)this->threadService == 0) {
    if (this->concurrentThread == (HANDLE)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1484,"(concurrentThread != 0)","concurrentThread != NULL");
      if (!bVar4) goto LAB_002897a9;
      *puVar1 = 0;
    }
    hEvent = this->concurrentWorkReadyEvent;
    if (hEvent == (HANDLE)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1485,"(concurrentWorkReadyEvent != 0)",
                         "concurrentWorkReadyEvent != NULL");
      if (!bVar4) goto LAB_002897a9;
      *puVar1 = 0;
      hEvent = this->concurrentWorkReadyEvent;
    }
    SetEvent(hEvent);
    bVar4 = true;
  }
  else {
    if (this->concurrentThread != (HANDLE)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1477,"(concurrentThread == 0)","concurrentThread == NULL");
      if (!bVar4) goto LAB_002897a9;
      *puVar1 = 0;
    }
    if (this->concurrentWorkReadyEvent != (HANDLE)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1478,"(concurrentWorkReadyEvent == 0)",
                         "concurrentWorkReadyEvent == NULL");
      if (!bVar4) {
LAB_002897a9:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar1 = 0;
    }
    pTVar2 = this->threadService;
    pTVar2[8] = (ThreadService)0x1;
    cVar5 = (**(code **)pTVar2)(StaticBackgroundWorkCallback,this);
    pTVar2[8] = (ThreadService)0x0;
    bVar4 = true;
    if (cVar5 == '\0') {
      ObservableValue<Memory::CollectionState>::SetValue(&this->collectionState,newValue);
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool
Recycler::StartConcurrent(CollectionState const state)
{
    // Reset the tick count to detect if the concurrent thread is taking too long
    tickCountStartConcurrent = GetTickCount();

    CollectionState oldState = this->collectionState;
    this->SetCollectionState(state);

    if (threadService->HasCallback())
    {
        Assert(concurrentThread == NULL);
        Assert(concurrentWorkReadyEvent == NULL);

        if (!threadService->Invoke(Recycler::StaticBackgroundWorkCallback, this))
        {
            this->SetCollectionState(oldState);
            return false;
        }

        return true;
    }
    else
    {
        Assert(concurrentThread != NULL);
        Assert(concurrentWorkReadyEvent != NULL);

        SetEvent(concurrentWorkReadyEvent);
        return true;
    }
}